

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::captureValues<char[7],char[14]>
          (Capturer *this,size_t index,char (*value) [7],char (*values) [14])

{
  string local_40;
  
  StringMaker<char[7],void>::convert_abi_cxx11_(&local_40,(StringMaker<char[7],void> *)value,*value)
  ;
  captureValue(this,index,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  captureValues<char[14]>(this,index + 1,values);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }